

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barcode.h
# Opt level: O1

void __thiscall
barcode_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
::barcode_output_t(barcode_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
                   *this,flagser_parameters *params)

{
  undefined2 uVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  undefined2 uVar4;
  pointer pcVar5;
  undefined1 auVar6 [16];
  string local_40;
  
  pcVar5 = (params->output_name)._M_dataplus._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar5,pcVar5 + (params->output_name)._M_string_length);
  file_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
  ::file_output_t(&this->
                   super_file_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
                  ,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  (this->
  super_file_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
  ).
  super_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
  ._vptr_output_t = (_func_int **)&PTR__barcode_output_t_0014f968;
  this->current_dimension = 0;
  uVar1 = params->max_dimension;
  uVar2 = params->min_dimension;
  uVar3 = params->modulus;
  uVar4 = *(undefined2 *)&params->field_0x6;
  auVar6._6_2_ = uVar4;
  auVar6._4_2_ = uVar3;
  auVar6._2_2_ = uVar2;
  auVar6._0_2_ = uVar1;
  auVar6._8_8_ = 0;
  auVar6 = pshuflw(auVar6,auVar6,0xe1);
  this->min_dimension = (short)auVar6._0_4_;
  this->max_dimension = (short)((uint)auVar6._0_4_ >> 0x10);
  this->modulus = params->modulus;
  (this->betti).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->betti).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->betti).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  (this->skipped).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->skipped).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->euler_characteristic = 0;
  return;
}

Assistant:

barcode_output_t(const flagser_parameters& params)
	    : file_output_t<Complex>(params.output_name), min_dimension(params.min_dimension),
	      max_dimension(params.max_dimension), modulus(params.modulus) {}